

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall
Centaurus::ATNNode<wchar_t>::print(ATNNode<wchar_t> *this,wostream *os,int index,wstring *prefix)

{
  wostream *pwVar1;
  wstring *prefix_local;
  int index_local;
  wostream *os_local;
  ATNNode<wchar_t> *this_local;
  
  switch(this->m_type) {
  case Blank:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar1 = std::operator<<(pwVar1,L" [ label=\"\", xlabel=\"[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,index);
    pwVar1 = std::operator<<(pwVar1,L"]\" ];");
    std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
    break;
  case Nonterminal:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar1 = std::operator<<(pwVar1,L" [ label=\"");
    pwVar1 = Centaurus::operator<<(pwVar1,&this->m_invoke);
    pwVar1 = std::operator<<(pwVar1,L"\", xlabel=\"[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,index);
    pwVar1 = std::operator<<(pwVar1,"]\" ];");
    std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
    break;
  case LiteralTerminal:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar1 = std::operator<<(pwVar1,L" [ label=\"\\\"\\\"");
    pwVar1 = std::operator<<(pwVar1,L"\", xlabel=\"[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,index);
    pwVar1 = std::operator<<(pwVar1,L"]\" ];");
    std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
    break;
  case RegularTerminal:
    NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::print_subgraph
              (&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>,os,index,prefix)
    ;
    break;
  case WhiteSpace:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar1 = std::operator<<(pwVar1,L" [ label=\"[ ]\", xlabel=\"[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,index);
    pwVar1 = std::operator<<(pwVar1,L"]\" ];");
    std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  }
  return;
}

Assistant:

void print(std::wostream& os, int index, const std::wstring& prefix) const
	{
		switch (m_type)
		{
		case ATNNodeType::Blank:
			os << prefix << L" [ label=\"\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		case ATNNodeType::Nonterminal:
			os << prefix << L" [ label=\"" << m_invoke << L"\", xlabel=\"[" << index << "]\" ];" << std::endl;
			break;
		case ATNNodeType::LiteralTerminal:
			os << prefix << L" [ label=\"\\\"\\\"" << /*m_literal <<*/ L"\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		case ATNNodeType::RegularTerminal:
			m_nfa.print_subgraph(os, index, prefix);
			break;
		case ATNNodeType::WhiteSpace:
			os << prefix << L" [ label=\"[ ]\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		}
	}